

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void printInfo(char *fileName)

{
  long *plVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ostream *poVar7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_node_base *p_Var9;
  long lVar10;
  string *psVar11;
  int iVar12;
  char *pcVar13;
  int i;
  int iVar14;
  MultiPartInputFile in;
  TimeCode local_38 [8];
  
  iVar4 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(&in,fileName,iVar4,true);
  iVar4 = Imf_3_2::MultiPartInputFile::parts();
  uVar5 = 1;
  iVar14 = 0;
  while ((iVar14 < iVar4 && ((uVar5 & 1) != 0))) {
    uVar5 = Imf_3_2::MultiPartInputFile::partComplete((int)&in);
    iVar14 = iVar14 + 1;
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"\nfile ");
  poVar7 = std::operator<<(poVar7,fileName);
  pcVar13 = " (incomplete)";
  if ((uVar5 & 1) != 0) {
    pcVar13 = "";
  }
  poVar7 = std::operator<<(poVar7,pcVar13);
  std::operator<<(poVar7,":\n\n");
  poVar7 = std::operator<<((ostream *)&std::cout,"file format version: ");
  bVar2 = Imf_3_2::MultiPartInputFile::version();
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,(uint)bVar2);
  poVar7 = std::operator<<(poVar7,", flags 0x");
  *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
       *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 8;
  uVar5 = Imf_3_2::MultiPartInputFile::version();
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar5 & 0xffffff00);
  *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
       *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::operator<<(poVar7,"\n");
  iVar12 = 0;
  iVar14 = 0;
  if (0 < iVar4) {
    iVar14 = iVar4;
  }
  for (; iVar12 != iVar14; iVar12 = iVar12 + 1) {
    Imf_3_2::MultiPartInputFile::header((int)&in);
    if (iVar4 != 1) {
      poVar7 = std::operator<<((ostream *)&std::cout,"\n\n part ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar12);
      cVar3 = Imf_3_2::MultiPartInputFile::partComplete((int)&in);
      pcVar13 = " (incomplete)";
      if (cVar3 != '\0') {
        pcVar13 = "";
      }
      poVar7 = std::operator<<(poVar7,pcVar13);
      std::operator<<(poVar7,":\n");
    }
    for (p_Var8 = (_Rb_tree_node_base *)Imf_3_2::Header::begin();
        p_Var9 = (_Rb_tree_node_base *)Imf_3_2::Header::end(), p_Var8 != p_Var9;
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      plVar1 = *(long **)(p_Var8 + 9);
      poVar7 = std::operator<<((ostream *)&std::cout,(char *)(p_Var8 + 1));
      poVar7 = std::operator<<(poVar7," (type ");
      pcVar13 = (char *)(**(code **)(*plVar1 + 0x10))(plVar1);
      poVar7 = std::operator<<(poVar7,pcVar13);
      std::operator<<(poVar7,")");
      lVar10 = __dynamic_cast(plVar1,&Imf_3_2::Attribute::typeinfo,
                              &Imf_3_2::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>>>::
                               typeinfo,0);
      if (lVar10 == 0) {
        lVar10 = __dynamic_cast(plVar1,&Imf_3_2::Attribute::typeinfo,
                                &Imf_3_2::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>>>::
                                 typeinfo,0);
        if (lVar10 == 0) {
          lVar10 = __dynamic_cast(plVar1,&Imf_3_2::Attribute::typeinfo,
                                  &Imf_3_2::TypedAttribute<Imf_3_2::ChannelList>::typeinfo,0);
          if (lVar10 == 0) {
            lVar10 = __dynamic_cast(plVar1,&Imf_3_2::Attribute::typeinfo,
                                    &Imf_3_2::TypedAttribute<Imf_3_2::Chromaticities>::typeinfo,0);
            if (lVar10 == 0) {
              lVar10 = __dynamic_cast(plVar1,&Imf_3_2::Attribute::typeinfo,
                                      &Imf_3_2::TypedAttribute<Imf_3_2::Compression>::typeinfo,0);
              if (lVar10 == 0) {
                lVar10 = __dynamic_cast(plVar1,&Imf_3_2::Attribute::typeinfo,
                                        &Imf_3_2::TypedAttribute<double>::typeinfo,0);
                if (lVar10 == 0) {
                  lVar10 = __dynamic_cast(plVar1,&Imf_3_2::Attribute::typeinfo,
                                          &Imf_3_2::TypedAttribute<Imf_3_2::Envmap>::typeinfo,0);
                  if (lVar10 == 0) {
                    lVar10 = __dynamic_cast(plVar1,&Imf_3_2::Attribute::typeinfo,
                                            &Imf_3_2::TypedAttribute<float>::typeinfo,0);
                    if (lVar10 == 0) {
                      lVar10 = __dynamic_cast(plVar1,&Imf_3_2::Attribute::typeinfo,
                                              &Imf_3_2::TypedAttribute<int>::typeinfo,0);
                      if (lVar10 == 0) {
                        lVar10 = __dynamic_cast(plVar1,&Imf_3_2::Attribute::typeinfo,
                                                &Imf_3_2::TypedAttribute<Imf_3_2::KeyCode>::typeinfo
                                                ,0);
                        if (lVar10 == 0) {
                          lVar10 = __dynamic_cast(plVar1,&Imf_3_2::Attribute::typeinfo,
                                                  &Imf_3_2::TypedAttribute<Imf_3_2::LineOrder>::
                                                   typeinfo,0);
                          if (lVar10 == 0) {
                            lVar10 = __dynamic_cast(plVar1,&Imf_3_2::Attribute::typeinfo,
                                                    &Imf_3_2::
                                                  TypedAttribute<Imath_3_2::Matrix33<float>>::
                                                  typeinfo,0);
                            if (lVar10 == 0) {
                              lVar10 = __dynamic_cast(plVar1,&Imf_3_2::Attribute::typeinfo,
                                                      &Imf_3_2::
                                                  TypedAttribute<Imath_3_2::Matrix44<float>>::
                                                  typeinfo,0);
                              if (lVar10 == 0) {
                                lVar10 = __dynamic_cast(plVar1,&Imf_3_2::Attribute::typeinfo,
                                                        &Imf_3_2::
                                                  TypedAttribute<Imf_3_2::PreviewImage>::typeinfo,0)
                                ;
                                if (lVar10 == 0) {
                                  lVar10 = __dynamic_cast(plVar1,&Imf_3_2::Attribute::typeinfo,
                                                          &Imf_3_2::
                                                  TypedAttribute<std::__cxx11::string>::typeinfo,0);
                                  if (lVar10 == 0) {
                                    lVar10 = __dynamic_cast(plVar1,&Imf_3_2::Attribute::typeinfo,
                                                            &Imf_3_2::
                                                  TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                                  ::typeinfo,0);
                                    if (lVar10 == 0) {
                                      lVar10 = __dynamic_cast(plVar1,&Imf_3_2::Attribute::typeinfo,
                                                              &Imf_3_2::
                                                  TypedAttribute<Imf_3_2::Rational>::typeinfo,0);
                                      if (lVar10 == 0) {
                                        lVar10 = __dynamic_cast(plVar1,&Imf_3_2::Attribute::typeinfo
                                                                ,&Imf_3_2::
                                                  TypedAttribute<Imf_3_2::TileDescription>::typeinfo
                                                  ,0);
                                        if (lVar10 == 0) {
                                          lVar10 = __dynamic_cast(plVar1,&Imf_3_2::Attribute::
                                                                          typeinfo,
                                                                  &Imf_3_2::
                                                  TypedAttribute<Imf_3_2::TimeCode>::typeinfo,0);
                                          if (lVar10 == 0) {
                                            lVar10 = __dynamic_cast(plVar1,&Imf_3_2::Attribute::
                                                                            typeinfo,
                                                                    &Imf_3_2::
                                                  TypedAttribute<Imath_3_2::Vec2<int>>::typeinfo,0);
                                            if (lVar10 == 0) {
                                              lVar10 = __dynamic_cast(plVar1,&Imf_3_2::Attribute::
                                                                              typeinfo,
                                                                      &Imf_3_2::
                                                  TypedAttribute<Imath_3_2::Vec2<float>>::typeinfo,0
                                                  );
                                              if (lVar10 == 0) {
                                                lVar10 = __dynamic_cast(plVar1,&Imf_3_2::Attribute::
                                                                                typeinfo,
                                                                        &Imf_3_2::
                                                  TypedAttribute<Imath_3_2::Vec3<int>>::typeinfo,0);
                                                if (lVar10 == 0) {
                                                  lVar10 = __dynamic_cast(plVar1,&Imf_3_2::Attribute
                                                                                  ::typeinfo,
                                                                          &Imf_3_2::
                                                  TypedAttribute<Imath_3_2::Vec3<float>>::typeinfo,0
                                                  );
                                                  if (lVar10 != 0) {
                                                    poVar7 = std::operator<<((ostream *)&std::cout,
                                                                             ": ");
                                                    Imath_3_2::operator<<
                                                              (poVar7,(Vec3<float> *)(lVar10 + 8));
                                                  }
                                                }
                                                else {
                                                  poVar7 = std::operator<<((ostream *)&std::cout,
                                                                           ": ");
                                                  Imath_3_2::operator<<
                                                            (poVar7,(Vec3<int> *)(lVar10 + 8));
                                                }
                                              }
                                              else {
                                                poVar7 = std::operator<<((ostream *)&std::cout,": ")
                                                ;
                                                Imath_3_2::operator<<
                                                          (poVar7,(Vec2<float> *)(lVar10 + 8));
                                              }
                                            }
                                            else {
                                              poVar7 = std::operator<<((ostream *)&std::cout,": ");
                                              Imath_3_2::operator<<
                                                        (poVar7,(Vec2<int> *)(lVar10 + 8));
                                            }
                                          }
                                          else {
                                            std::operator<<((ostream *)&std::cout,":\n");
                                            Imf_3_2::TimeCode::TimeCode
                                                      (local_38,(TimeCode *)(lVar10 + 8));
                                            printTimeCode(local_38);
                                          }
                                        }
                                        else {
                                          std::operator<<((ostream *)&std::cout,":\n    ");
                                          printLevelMode(*(LevelMode *)(lVar10 + 0x10));
                                          poVar7 = std::operator<<((ostream *)&std::cout,
                                                                   "\n    tile size ");
                                          poVar7 = std::ostream::_M_insert<unsigned_long>
                                                             ((ulong)poVar7);
                                          poVar7 = std::operator<<(poVar7," by ");
                                          poVar7 = std::ostream::_M_insert<unsigned_long>
                                                             ((ulong)poVar7);
                                          std::operator<<(poVar7," pixels");
                                          if (*(int *)(lVar10 + 0x10) != 0) {
                                            std::operator<<((ostream *)&std::cout,
                                                            "\n    level sizes rounded ");
                                            printLevelRoundingMode
                                                      (*(LevelRoundingMode *)(lVar10 + 0x14));
                                          }
                                        }
                                      }
                                      else {
                                        poVar7 = std::operator<<((ostream *)&std::cout,": ");
                                        poVar7 = (ostream *)
                                                 std::ostream::operator<<
                                                           (poVar7,*(int *)(lVar10 + 8));
                                        poVar7 = std::operator<<(poVar7,"/");
                                        poVar7 = std::ostream::_M_insert<unsigned_long>
                                                           ((ulong)poVar7);
                                        std::operator<<(poVar7," (");
                                        poVar7 = std::ostream::_M_insert<double>
                                                           ((double)*(int *)(lVar10 + 8) /
                                                            (double)*(uint *)(lVar10 + 0xc));
                                        std::operator<<(poVar7,")");
                                      }
                                    }
                                    else {
                                      std::operator<<((ostream *)&std::cout,":");
                                      for (psVar11 = *(string **)(lVar10 + 8);
                                          psVar11 != *(string **)(lVar10 + 0x10);
                                          psVar11 = psVar11 + 0x20) {
                                        poVar7 = std::operator<<((ostream *)&std::cout,"\n    \"");
                                        poVar7 = std::operator<<(poVar7,psVar11);
                                        std::operator<<(poVar7,"\"");
                                      }
                                    }
                                  }
                                  else {
                                    poVar7 = std::operator<<((ostream *)&std::cout,": \"");
                                    poVar7 = std::operator<<(poVar7,(string *)(lVar10 + 8));
                                    std::operator<<(poVar7,"\"");
                                  }
                                }
                                else {
                                  poVar7 = std::operator<<((ostream *)&std::cout,": ");
                                  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                                  poVar7 = std::operator<<(poVar7," by ");
                                  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                                  std::operator<<(poVar7," pixels");
                                }
                              }
                              else {
                                poVar7 = std::operator<<((ostream *)&std::cout,":\n   (");
                                poVar7 = (ostream *)
                                         std::ostream::operator<<(poVar7,*(float *)(lVar10 + 8));
                                poVar7 = std::operator<<(poVar7," ");
                                poVar7 = (ostream *)
                                         std::ostream::operator<<(poVar7,*(float *)(lVar10 + 0xc));
                                poVar7 = std::operator<<(poVar7," ");
                                poVar7 = (ostream *)
                                         std::ostream::operator<<(poVar7,*(float *)(lVar10 + 0x10));
                                poVar7 = std::operator<<(poVar7," ");
                                poVar7 = (ostream *)
                                         std::ostream::operator<<(poVar7,*(float *)(lVar10 + 0x14));
                                poVar7 = std::operator<<(poVar7,"\n    ");
                                poVar7 = (ostream *)
                                         std::ostream::operator<<(poVar7,*(float *)(lVar10 + 0x18));
                                poVar7 = std::operator<<(poVar7," ");
                                poVar7 = (ostream *)
                                         std::ostream::operator<<(poVar7,*(float *)(lVar10 + 0x1c));
                                poVar7 = std::operator<<(poVar7," ");
                                poVar7 = (ostream *)
                                         std::ostream::operator<<(poVar7,*(float *)(lVar10 + 0x20));
                                poVar7 = std::operator<<(poVar7," ");
                                poVar7 = (ostream *)
                                         std::ostream::operator<<(poVar7,*(float *)(lVar10 + 0x24));
                                poVar7 = std::operator<<(poVar7,"\n    ");
                                poVar7 = (ostream *)
                                         std::ostream::operator<<(poVar7,*(float *)(lVar10 + 0x28));
                                poVar7 = std::operator<<(poVar7," ");
                                poVar7 = (ostream *)
                                         std::ostream::operator<<(poVar7,*(float *)(lVar10 + 0x2c));
                                poVar7 = std::operator<<(poVar7," ");
                                poVar7 = (ostream *)
                                         std::ostream::operator<<(poVar7,*(float *)(lVar10 + 0x30));
                                poVar7 = std::operator<<(poVar7," ");
                                poVar7 = (ostream *)
                                         std::ostream::operator<<(poVar7,*(float *)(lVar10 + 0x34));
                                poVar7 = std::operator<<(poVar7,"\n    ");
                                poVar7 = (ostream *)
                                         std::ostream::operator<<(poVar7,*(float *)(lVar10 + 0x38));
                                poVar7 = std::operator<<(poVar7," ");
                                poVar7 = (ostream *)
                                         std::ostream::operator<<(poVar7,*(float *)(lVar10 + 0x3c));
                                poVar7 = std::operator<<(poVar7," ");
                                poVar7 = (ostream *)
                                         std::ostream::operator<<(poVar7,*(float *)(lVar10 + 0x40));
                                poVar7 = std::operator<<(poVar7," ");
                                poVar7 = (ostream *)
                                         std::ostream::operator<<(poVar7,*(float *)(lVar10 + 0x44));
                                std::operator<<(poVar7,")");
                              }
                            }
                            else {
                              poVar7 = std::operator<<((ostream *)&std::cout,":\n   (");
                              poVar7 = (ostream *)
                                       std::ostream::operator<<(poVar7,*(float *)(lVar10 + 8));
                              poVar7 = std::operator<<(poVar7," ");
                              poVar7 = (ostream *)
                                       std::ostream::operator<<(poVar7,*(float *)(lVar10 + 0xc));
                              poVar7 = std::operator<<(poVar7," ");
                              poVar7 = (ostream *)
                                       std::ostream::operator<<(poVar7,*(float *)(lVar10 + 0x10));
                              poVar7 = std::operator<<(poVar7,"\n    ");
                              poVar7 = (ostream *)
                                       std::ostream::operator<<(poVar7,*(float *)(lVar10 + 0x14));
                              poVar7 = std::operator<<(poVar7," ");
                              poVar7 = (ostream *)
                                       std::ostream::operator<<(poVar7,*(float *)(lVar10 + 0x18));
                              poVar7 = std::operator<<(poVar7," ");
                              poVar7 = (ostream *)
                                       std::ostream::operator<<(poVar7,*(float *)(lVar10 + 0x1c));
                              poVar7 = std::operator<<(poVar7,"\n    ");
                              poVar7 = (ostream *)
                                       std::ostream::operator<<(poVar7,*(float *)(lVar10 + 0x20));
                              poVar7 = std::operator<<(poVar7," ");
                              poVar7 = (ostream *)
                                       std::ostream::operator<<(poVar7,*(float *)(lVar10 + 0x24));
                              poVar7 = std::operator<<(poVar7," ");
                              poVar7 = (ostream *)
                                       std::ostream::operator<<(poVar7,*(float *)(lVar10 + 0x28));
                              std::operator<<(poVar7,")");
                            }
                          }
                          else {
                            std::operator<<((ostream *)&std::cout,": ");
                            printLineOrder(*(LineOrder *)(lVar10 + 8));
                          }
                        }
                        else {
                          poVar7 = std::operator<<((ostream *)&std::cout,
                                                   ":\n    film manufacturer code ");
                          iVar6 = Imf_3_2::KeyCode::filmMfcCode();
                          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
                          poVar7 = std::operator<<(poVar7,"\n    film type code ");
                          iVar6 = Imf_3_2::KeyCode::filmType();
                          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
                          poVar7 = std::operator<<(poVar7,"\n    prefix ");
                          iVar6 = Imf_3_2::KeyCode::prefix();
                          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
                          poVar7 = std::operator<<(poVar7,"\n    count ");
                          iVar6 = Imf_3_2::KeyCode::count();
                          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
                          poVar7 = std::operator<<(poVar7,"\n    perf offset ");
                          iVar6 = Imf_3_2::KeyCode::perfOffset();
                          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
                          poVar7 = std::operator<<(poVar7,"\n    perfs per frame ");
                          iVar6 = Imf_3_2::KeyCode::perfsPerFrame();
                          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
                          poVar7 = std::operator<<(poVar7,"\n    perfs per count ");
                          iVar6 = Imf_3_2::KeyCode::perfsPerCount();
                          std::ostream::operator<<(poVar7,iVar6);
                        }
                      }
                      else {
                        poVar7 = std::operator<<((ostream *)&std::cout,": ");
                        std::ostream::operator<<(poVar7,*(int *)(lVar10 + 8));
                      }
                    }
                    else {
                      poVar7 = std::operator<<((ostream *)&std::cout,": ");
                      std::ostream::operator<<(poVar7,*(float *)(lVar10 + 8));
                    }
                  }
                  else {
                    std::operator<<((ostream *)&std::cout,": ");
                    printEnvmap((Envmap *)(lVar10 + 8));
                  }
                }
                else {
                  std::operator<<((ostream *)&std::cout,": ");
                  std::ostream::_M_insert<double>(*(double *)(lVar10 + 8));
                }
              }
              else {
                std::operator<<((ostream *)&std::cout,": ");
                printCompression(*(Compression *)(lVar10 + 8));
              }
            }
            else {
              poVar7 = std::operator<<((ostream *)&std::cout,":\n    red   ");
              poVar7 = Imath_3_2::operator<<(poVar7,(Vec2<float> *)(lVar10 + 8));
              poVar7 = std::operator<<(poVar7,"\n    green ");
              poVar7 = Imath_3_2::operator<<(poVar7,(Vec2<float> *)(lVar10 + 0x10));
              poVar7 = std::operator<<(poVar7,"\n    blue  ");
              poVar7 = Imath_3_2::operator<<(poVar7,(Vec2<float> *)(lVar10 + 0x18));
              poVar7 = std::operator<<(poVar7,"\n    white ");
              Imath_3_2::operator<<(poVar7,(Vec2<float> *)(lVar10 + 0x20));
            }
          }
          else {
            std::operator<<((ostream *)&std::cout,":");
            printChannelList((ChannelList *)(lVar10 + 8));
          }
        }
        else {
          poVar7 = std::operator<<((ostream *)&std::cout,": ");
          poVar7 = Imath_3_2::operator<<(poVar7,(Vec2<float> *)(lVar10 + 8));
          poVar7 = std::operator<<(poVar7," - ");
          Imath_3_2::operator<<(poVar7,(Vec2<float> *)(lVar10 + 0x10));
        }
      }
      else {
        poVar7 = std::operator<<((ostream *)&std::cout,": ");
        poVar7 = Imath_3_2::operator<<(poVar7,(Vec2<int> *)(lVar10 + 8));
        poVar7 = std::operator<<(poVar7," - ");
        Imath_3_2::operator<<(poVar7,(Vec2<int> *)(lVar10 + 0x10));
      }
      std::operator<<((ostream *)&std::cout,'\n');
    }
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile(&in);
  return;
}

Assistant:

void
printInfo (const char fileName[])
{
    MultiPartInputFile in (fileName);
    int                parts = in.parts ();

    //
    // Check to see if any parts are incomplete
    //

    bool fileComplete = true;

    for (int i = 0; i < parts && fileComplete; ++i)
        if (!in.partComplete (i)) fileComplete = false;

    //
    // Print file name and file format version
    //

    cout << "\nfile " << fileName << (fileComplete ? "" : " (incomplete)")
         << ":\n\n";

    cout << "file format version: " << getVersion (in.version ())
         << ", "
            "flags 0x"
         << setbase (16) << getFlags (in.version ()) << setbase (10) << "\n";

    //
    // Print the header of every part in the file
    //

    for (int p = 0; p < parts; ++p)
    {
        const Header& h = in.header (p);

        if (parts != 1)
        {
            cout << "\n\n part " << p
                 << (in.partComplete (p) ? "" : " (incomplete)") << ":\n";
        }

        for (Header::ConstIterator i = h.begin (); i != h.end (); ++i)
        {
            const Attribute* a = &i.attribute ();
            cout << i.name () << " (type " << a->typeName () << ")";

            if (const Box2iAttribute* ta =
                    dynamic_cast<const Box2iAttribute*> (a))
            {
                cout << ": " << ta->value ().min << " - " << ta->value ().max;
            }

            else if (
                const Box2fAttribute* ta =
                    dynamic_cast<const Box2fAttribute*> (a))
            {
                cout << ": " << ta->value ().min << " - " << ta->value ().max;
            }
            else if (
                const ChannelListAttribute* ta =
                    dynamic_cast<const ChannelListAttribute*> (a))
            {
                cout << ":";
                printChannelList (ta->value ());
            }
            else if (
                const ChromaticitiesAttribute* ta =
                    dynamic_cast<const ChromaticitiesAttribute*> (a))
            {
                cout << ":\n"
                        "    red   "
                     << ta->value ().red
                     << "\n"
                        "    green "
                     << ta->value ().green
                     << "\n"
                        "    blue  "
                     << ta->value ().blue
                     << "\n"
                        "    white "
                     << ta->value ().white;
            }
            else if (
                const CompressionAttribute* ta =
                    dynamic_cast<const CompressionAttribute*> (a))
            {
                cout << ": ";
                printCompression (ta->value ());
            }
            else if (
                const DoubleAttribute* ta =
                    dynamic_cast<const DoubleAttribute*> (a))
            {
                cout << ": " << ta->value ();
            }
            else if (
                const EnvmapAttribute* ta =
                    dynamic_cast<const EnvmapAttribute*> (a))
            {
                cout << ": ";
                printEnvmap (ta->value ());
            }
            else if (
                const FloatAttribute* ta =
                    dynamic_cast<const FloatAttribute*> (a))
            {
                cout << ": " << ta->value ();
            }
            else if (
                const IntAttribute* ta = dynamic_cast<const IntAttribute*> (a))
            {
                cout << ": " << ta->value ();
            }
            else if (
                const KeyCodeAttribute* ta =
                    dynamic_cast<const KeyCodeAttribute*> (a))
            {
                cout << ":\n"
                        "    film manufacturer code "
                     << ta->value ().filmMfcCode ()
                     << "\n"
                        "    film type code "
                     << ta->value ().filmType ()
                     << "\n"
                        "    prefix "
                     << ta->value ().prefix ()
                     << "\n"
                        "    count "
                     << ta->value ().count ()
                     << "\n"
                        "    perf offset "
                     << ta->value ().perfOffset ()
                     << "\n"
                        "    perfs per frame "
                     << ta->value ().perfsPerFrame ()
                     << "\n"
                        "    perfs per count "
                     << ta->value ().perfsPerCount ();
            }
            else if (
                const LineOrderAttribute* ta =
                    dynamic_cast<const LineOrderAttribute*> (a))
            {
                cout << ": ";
                printLineOrder (ta->value ());
            }
            else if (
                const M33fAttribute* ta =
                    dynamic_cast<const M33fAttribute*> (a))
            {
                cout << ":\n"
                        "   ("
                     << ta->value ()[0][0] << " " << ta->value ()[0][1] << " "
                     << ta->value ()[0][2] << "\n    " << ta->value ()[1][0]
                     << " " << ta->value ()[1][1] << " " << ta->value ()[1][2]
                     << "\n    " << ta->value ()[2][0] << " "
                     << ta->value ()[2][1] << " " << ta->value ()[2][2] << ")";
            }
            else if (
                const M44fAttribute* ta =
                    dynamic_cast<const M44fAttribute*> (a))
            {
                cout << ":\n"
                        "   ("
                     << ta->value ()[0][0] << " " << ta->value ()[0][1] << " "
                     << ta->value ()[0][2] << " " << ta->value ()[0][3]
                     << "\n    " << ta->value ()[1][0] << " "
                     << ta->value ()[1][1] << " " << ta->value ()[1][2] << " "
                     << ta->value ()[1][3] << "\n    " << ta->value ()[2][0]
                     << " " << ta->value ()[2][1] << " " << ta->value ()[2][2]
                     << " " << ta->value ()[2][3] << "\n    "
                     << ta->value ()[3][0] << " " << ta->value ()[3][1] << " "
                     << ta->value ()[3][2] << " " << ta->value ()[3][3] << ")";
            }
            else if (
                const PreviewImageAttribute* ta =
                    dynamic_cast<const PreviewImageAttribute*> (a))
            {
                cout << ": " << ta->value ().width () << " by "
                     << ta->value ().height () << " pixels";
            }
            else if (
                const StringAttribute* ta =
                    dynamic_cast<const StringAttribute*> (a))
            {
                cout << ": \"" << ta->value () << "\"";
            }
            else if (
                const StringVectorAttribute* ta =
                    dynamic_cast<const StringVectorAttribute*> (a))
            {
                cout << ":";

                for (StringVector::const_iterator i = ta->value ().begin ();
                     i != ta->value ().end ();
                     ++i)
                {
                    cout << "\n    \"" << *i << "\"";
                }
            }
            else if (
                const RationalAttribute* ta =
                    dynamic_cast<const RationalAttribute*> (a))
            {
                cout << ": " << ta->value ().n << "/" << ta->value ().d << " ("
                     << double (ta->value ()) << ")";
            }
            else if (
                const TileDescriptionAttribute* ta =
                    dynamic_cast<const TileDescriptionAttribute*> (a))
            {
                cout << ":\n    ";

                printLevelMode (ta->value ().mode);

                cout << "\n    tile size " << ta->value ().xSize << " by "
                     << ta->value ().ySize << " pixels";

                if (ta->value ().mode != ONE_LEVEL)
                {
                    cout << "\n    level sizes rounded ";
                    printLevelRoundingMode (ta->value ().roundingMode);
                }
            }
            else if (
                const TimeCodeAttribute* ta =
                    dynamic_cast<const TimeCodeAttribute*> (a))
            {
                cout << ":\n";
                printTimeCode (ta->value ());
            }
            else if (
                const V2iAttribute* ta = dynamic_cast<const V2iAttribute*> (a))
            {
                cout << ": " << ta->value ();
            }
            else if (
                const V2fAttribute* ta = dynamic_cast<const V2fAttribute*> (a))
            {
                cout << ": " << ta->value ();
            }
            else if (
                const V3iAttribute* ta = dynamic_cast<const V3iAttribute*> (a))
            {
                cout << ": " << ta->value ();
            }
            else if (
                const V3fAttribute* ta = dynamic_cast<const V3fAttribute*> (a))
            {
                cout << ": " << ta->value ();
            }

            cout << '\n';
        }
    }

    cout << endl;
}